

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uregex.cpp
# Opt level: O0

int32_t icu_63::RegexCImpl::appendTail
                  (RegularExpression *regexp,UChar **destBuf,int32_t *destCapacity,
                  UErrorCode *status)

{
  UBool UVar1;
  long local_78;
  int64_t local_70;
  int64_t srcIdx_1;
  UChar c;
  long lStack_60;
  UErrorCode newStatus;
  int64_t nativeIdx;
  UChar *pUStack_50;
  int32_t srcIdx;
  UChar *dest;
  int32_t destCap;
  int32_t destIdx;
  RegexMatcher *m;
  UErrorCode *pUStack_30;
  UBool pendingBufferOverflow;
  UErrorCode *status_local;
  int32_t *destCapacity_local;
  UChar **destBuf_local;
  RegularExpression *regexp_local;
  
  m._7_1_ = '\0';
  if (((*status == U_BUFFER_OVERFLOW_ERROR) && (destCapacity != (int32_t *)0x0)) &&
     (*destCapacity == 0)) {
    m._7_1_ = '\x01';
    *status = U_ZERO_ERROR;
  }
  pUStack_30 = status;
  status_local = destCapacity;
  destCapacity_local = (int32_t *)destBuf;
  destBuf_local = (UChar **)regexp;
  UVar1 = validateRE(regexp,'\x01',status);
  if (UVar1 == '\0') {
    regexp_local._4_4_ = U_ZERO_ERROR;
  }
  else if ((((status_local == (UErrorCode *)0x0) || (destCapacity_local == (int32_t *)0x0)) ||
           ((*(long *)destCapacity_local == 0 && (U_ZERO_ERROR < *status_local)))) ||
          (*status_local < U_ZERO_ERROR)) {
    *pUStack_30 = U_ILLEGAL_ARGUMENT_ERROR;
    regexp_local._4_4_ = U_ZERO_ERROR;
  }
  else {
    _destCap = destBuf_local[5];
    dest._4_4_ = U_ZERO_ERROR;
    dest._0_4_ = *status_local;
    pUStack_50 = *(UChar **)destCapacity_local;
    if (destBuf_local[6] == (UChar *)0x0) {
      if ((char)_destCap[0x41] == '\0') {
        local_70 = *(int64_t *)(_destCap + 0x4c);
        if (local_70 == -1) {
          local_70 = 0;
        }
      }
      else {
        local_70 = *(int64_t *)(_destCap + 0x48);
      }
      dest._4_4_ = utext_extract_63(*(UText **)(_destCap + 0x10),local_70,
                                    *(int64_t *)(_destCap + 0x18),pUStack_50,(UErrorCode)dest,
                                    pUStack_30);
    }
    else {
      if ((char)_destCap[0x41] == '\0') {
        local_78 = *(long *)(_destCap + 0x4c);
      }
      else {
        local_78 = *(long *)(_destCap + 0x48);
      }
      lStack_60 = local_78;
      if (local_78 == -1) {
        nativeIdx._4_4_ = 0;
      }
      else if (*(long *)(*(long *)(*(long *)(_destCap + 0x10) + 0x38) + 0x48) == 0) {
        nativeIdx._4_4_ = (int)local_78;
      }
      else {
        srcIdx_1._4_4_ = 0;
        nativeIdx._4_4_ =
             utext_extract_63(*(UText **)(_destCap + 0x10),0,local_78,(UChar *)0x0,0,
                              (UErrorCode *)((long)&srcIdx_1 + 4));
      }
      for (; nativeIdx._4_4_ != *(int *)(destBuf_local + 7); nativeIdx._4_4_ = nativeIdx._4_4_ + 1)
      {
        srcIdx_1._2_2_ = destBuf_local[6][nativeIdx._4_4_];
        if ((srcIdx_1._2_2_ == L'\0') && (*(int *)(destBuf_local + 7) == -1)) {
          *(int *)(destBuf_local + 7) = nativeIdx._4_4_;
          break;
        }
        if (dest._4_4_ < (UErrorCode)dest) {
          pUStack_50[dest._4_4_] = srcIdx_1._2_2_;
        }
        else if (0 < *(int *)(destBuf_local + 7)) {
          dest._4_4_ = (*(int *)(destBuf_local + 7) - nativeIdx._4_4_) + dest._4_4_;
          break;
        }
        dest._4_4_ = dest._4_4_ + U_ILLEGAL_ARGUMENT_ERROR;
      }
    }
    if (dest._4_4_ < (UErrorCode)dest) {
      pUStack_50[dest._4_4_] = L'\0';
    }
    else if (dest._4_4_ == (UErrorCode)dest) {
      *pUStack_30 = U_STRING_NOT_TERMINATED_WARNING;
    }
    else {
      *pUStack_30 = U_BUFFER_OVERFLOW_ERROR;
    }
    if (dest._4_4_ < (UErrorCode)dest) {
      *(long *)destCapacity_local = *(long *)destCapacity_local + (long)dest._4_4_ * 2;
      *status_local = *status_local - dest._4_4_;
    }
    else if (*(long *)destCapacity_local != 0) {
      *(long *)destCapacity_local = *(long *)destCapacity_local + (long)(UErrorCode)dest * 2;
      *status_local = U_ZERO_ERROR;
    }
    if ((m._7_1_ != '\0') && (UVar1 = ::U_SUCCESS(*pUStack_30), UVar1 != '\0')) {
      *pUStack_30 = U_BUFFER_OVERFLOW_ERROR;
    }
    regexp_local._4_4_ = dest._4_4_;
  }
  return regexp_local._4_4_;
}

Assistant:

int32_t RegexCImpl::appendTail(RegularExpression    *regexp,
                               UChar                **destBuf,
                               int32_t               *destCapacity,
                               UErrorCode            *status)
{

    // If we come in with a buffer overflow error, don't suppress the operation.
    //  A series of appendReplacements, appendTail need to correctly preflight
    //  the buffer size when an overflow happens somewhere in the middle.
    UBool pendingBufferOverflow = FALSE;
    if (*status == U_BUFFER_OVERFLOW_ERROR && destCapacity != NULL && *destCapacity == 0) {
        pendingBufferOverflow = TRUE;
        *status = U_ZERO_ERROR;
    }

    if (validateRE(regexp, TRUE, status) == FALSE) {
        return 0;
    }

    if (destCapacity == NULL || destBuf == NULL ||
        (*destBuf == NULL && *destCapacity > 0) ||
        *destCapacity < 0)
    {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    RegexMatcher *m = regexp->fMatcher;

    int32_t  destIdx     = 0;
    int32_t  destCap     = *destCapacity;
    UChar    *dest       = *destBuf;

    if (regexp->fText != NULL) {
        int32_t srcIdx;
        int64_t nativeIdx = (m->fMatch ? m->fMatchEnd : m->fLastMatchEnd);
        if (nativeIdx == -1) {
            srcIdx = 0;
        } else if (UTEXT_USES_U16(m->fInputText)) {
            srcIdx = (int32_t)nativeIdx;
        } else {
            UErrorCode newStatus = U_ZERO_ERROR;
            srcIdx = utext_extract(m->fInputText, 0, nativeIdx, NULL, 0, &newStatus);
        }

        for (;;) {
            U_ASSERT(destIdx >= 0);

            if (srcIdx == regexp->fTextLength) {
                break;
            }
            UChar c = regexp->fText[srcIdx];
            if (c == 0 && regexp->fTextLength == -1) {
                regexp->fTextLength = srcIdx;
                break;
            }

            if (destIdx < destCap) {
                dest[destIdx] = c;
            } else {
                // We've overflowed the dest buffer.
                //  If the total input string length is known, we can
                //    compute the total buffer size needed without scanning through the string.
                if (regexp->fTextLength > 0) {
                    destIdx += (regexp->fTextLength - srcIdx);
                    break;
                }
            }
            srcIdx++;
            destIdx++;
        }
    } else {
        int64_t  srcIdx;
        if (m->fMatch) {
            // The most recent call to find() succeeded.
            srcIdx = m->fMatchEnd;
        } else {
            // The last call to find() on this matcher failed().
            //   Look back to the end of the last find() that succeeded for src index.
            srcIdx = m->fLastMatchEnd;
            if (srcIdx == -1)  {
                // There has been no successful match with this matcher.
                //   We want to copy the whole string.
                srcIdx = 0;
            }
        }

        destIdx = utext_extract(m->fInputText, srcIdx, m->fInputLength, dest, destCap, status);
    }

    //
    //  NUL terminate the output string, if possible, otherwise issue the
    //   appropriate error or warning.
    //
    if (destIdx < destCap) {
        dest[destIdx] = 0;
    } else  if (destIdx == destCap) {
        *status = U_STRING_NOT_TERMINATED_WARNING;
    } else {
        *status = U_BUFFER_OVERFLOW_ERROR;
    }

    //
    // Update the user's buffer ptr and capacity vars to reflect the
    //   amount used.
    //
    if (destIdx < destCap) {
        *destBuf      += destIdx;
        *destCapacity -= destIdx;
    } else if (*destBuf != NULL) {
        *destBuf      += destCap;
        *destCapacity  = 0;
    }

    if (pendingBufferOverflow && U_SUCCESS(*status)) {
        *status = U_BUFFER_OVERFLOW_ERROR;
    }

    return destIdx;
}